

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_init_arith(bitstream *str,h264_cabac_context *cabac)

{
  vs_dir vVar1;
  int iVar2;
  
  iVar2 = 0;
  if (cabac != (h264_cabac_context *)0x0) {
    if (str->bitpos == 7) {
      vVar1 = str->dir;
      cabac->codIRange = 0x1fe;
      if (vVar1 == VS_ENCODE) {
        cabac->codIOffset = 0;
        cabac->firstBitFlag = 1;
        cabac->bitsOutstanding = 0;
        return 0;
      }
      iVar2 = vs_u(str,&cabac->codIOffset,9);
      if (iVar2 == 0) {
        if (cabac->codIOffset < 0x1fe) {
          return 0;
        }
        h264_cabac_init_arith_cold_2();
      }
    }
    else {
      h264_cabac_init_arith_cold_1();
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int h264_cabac_init_arith (struct bitstream *str, struct h264_cabac_context *cabac) {
	if (!cabac)
		return 0;
	if (str->bitpos != 7) {
		fprintf (stderr, "Trying to init CABAC when not byte aligned\n");
		return 1;
	}
	if (str->dir == VS_ENCODE) {
		cabac->codIRange = 510;
		cabac->codIOffset = 0;
		cabac->firstBitFlag = 1;
		cabac->bitsOutstanding = 0;
	} else {
		cabac->codIRange = 510;
		if (vs_u(str, &cabac->codIOffset, 9))
			return 1;
		if (cabac->codIOffset >= 510) {
			fprintf (stderr, "Initial codIOffset >= 510\n");
			return 1;
		}
	}
	return 0;
}